

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_api.cpp
# Opt level: O3

void parallel_query_with_new_connection(DuckDB *db,bool *correct,size_t threadnr)

{
  _Head_base<0UL,_duckdb::Connection_*,_false> _Var1;
  bool bVar2;
  Connection *this;
  long lVar3;
  long lVar4;
  initializer_list<duckdb::Value> __l;
  allocator_type local_189;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> local_188;
  _Head_base<0UL,_duckdb::Connection_*,_false> local_180;
  bool *local_178;
  size_t local_170;
  DuckDB *local_168;
  LogicalType local_160 [24];
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_148;
  undefined1 *local_130 [2];
  undefined1 local_120 [48];
  Value local_f0 [64];
  Value local_b0 [64];
  Value local_70 [64];
  
  correct[threadnr] = true;
  lVar4 = 0;
  local_178 = correct;
  local_170 = threadnr;
  local_168 = db;
  do {
    this = (Connection *)operator_new(0x20);
    duckdb::Connection::Connection(this,local_168);
    local_180._M_head_impl = this;
    duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
    operator->((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
               &local_180);
    local_130[0] = local_120;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,"SELECT * FROM integers ORDER BY i","");
    duckdb::Connection::Query((string *)&local_188);
    if (local_130[0] != local_120) {
      operator_delete(local_130[0]);
    }
    duckdb::Value::Value((Value *)local_130,1);
    duckdb::Value::Value(local_f0,2);
    duckdb::Value::Value(local_b0,3);
    duckdb::LogicalType::LogicalType(local_160,SQLNULL);
    duckdb::Value::Value(local_70,local_160);
    __l._M_len = 4;
    __l._M_array = (iterator)local_130;
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector(&local_148,__l,&local_189);
    bVar2 = duckdb::CHECK_COLUMN
                      ((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                        *)&local_188,0,(vector<duckdb::Value,_true> *)&local_148);
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_148);
    lVar3 = 0xc0;
    do {
      duckdb::Value::~Value((Value *)((long)local_130 + lVar3));
      lVar3 = lVar3 + -0x40;
    } while (lVar3 != -0x40);
    duckdb::LogicalType::~LogicalType(local_160);
    if (!bVar2) {
      local_178[local_170] = false;
    }
    if (local_188._M_head_impl != (MaterializedQueryResult *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
    _Var1._M_head_impl = local_180._M_head_impl;
    if (local_180._M_head_impl != (Connection *)0x0) {
      duckdb::Connection::~Connection(local_180._M_head_impl);
      operator_delete(_Var1._M_head_impl);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 100);
  return;
}

Assistant:

static void parallel_query_with_new_connection(DuckDB *db, bool *correct, size_t threadnr) {
	correct[threadnr] = true;
	for (size_t i = 0; i < 100; i++) {
		auto conn = make_uniq<Connection>(*db);
		auto result = conn->Query("SELECT * FROM integers ORDER BY i");
		if (!CHECK_COLUMN(result, 0, {1, 2, 3, Value()})) {
			correct[threadnr] = false;
		}
	}
}